

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::NewSlotA(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQObjectPtr *attrs,
              bool bstatic,bool raw)

{
  bool bVar1;
  SQObjectPtr local_60;
  SQObjectPtr *local_50;
  SQObjectPtr *mm;
  SQClass *c;
  bool raw_local;
  SQObjectPtr *pSStack_38;
  bool bstatic_local;
  SQObjectPtr *attrs_local;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  c._6_1_ = raw;
  c._7_1_ = bstatic;
  pSStack_38 = attrs;
  attrs_local = val;
  val_local = key;
  key_local = self;
  self_local = (SQObjectPtr *)this;
  if ((self->super_SQObject)._type == OT_CLASS) {
    mm = (SQObjectPtr *)(self->super_SQObject)._unVal.pClass;
    if ((raw) || (local_50 = ((SQClass *)mm)->_metamethods + 0x10,
                 (local_50->super_SQObject)._type == OT_NULL)) {
      bVar1 = NewSlot(this,self,key,val,bstatic);
      if (bVar1) {
        if ((pSStack_38->super_SQObject)._type != OT_NULL) {
          SQClass::SetAttributes((SQClass *)mm,val_local,pSStack_38);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      Push(this,self);
      Push(this,val_local);
      Push(this,attrs_local);
      Push(this,pSStack_38);
      ::SQObjectPtr::SQObjectPtr(&local_60,(bool)(c._7_1_ & 1));
      Push(this,&local_60);
      ::SQObjectPtr::~SQObjectPtr(&local_60);
      this_local._7_1_ = CallMetaMethod(this,local_50,MT_NEWMEMBER,5,&this->temp_reg);
    }
  }
  else {
    Raise_Error(this,"object must be a class");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::NewSlotA(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,const SQObjectPtr &attrs,bool bstatic,bool raw)
{
    if(type(self) != OT_CLASS) {
        Raise_Error(_SC("object must be a class"));
        return false;
    }
    SQClass *c = _class(self);
    if(!raw) {
        SQObjectPtr &mm = c->_metamethods[MT_NEWMEMBER];
        if(type(mm) != OT_NULL ) {
            Push(self); Push(key); Push(val);
            Push(attrs);
            Push(bstatic);
            return CallMetaMethod(mm,MT_NEWMEMBER,5,temp_reg);
        }
    }
    if(!NewSlot(self, key, val,bstatic))
        return false;
    if(type(attrs) != OT_NULL) {
        c->SetAttributes(key,attrs);
    }
    return true;
}